

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MaxOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  interval_t *piVar2;
  MinMaxState<duckdb::interval_t> *pMVar3;
  int64_t iVar4;
  undefined8 uVar5;
  MinMaxState<duckdb::interval_t> **states_00;
  int32_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t input_00;
  interval_t input_01;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      piVar2 = (interval_t *)input->data;
      states_00 = (MinMaxState<duckdb::interval_t> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MaxOperation>
                (piVar2,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    piVar2 = (interval_t *)input->data;
    pMVar3 = *(MinMaxState<duckdb::interval_t> **)states->data;
    iVar6 = piVar2->days;
    iVar4 = piVar2->micros;
    if (pMVar3->isset == false) {
      (pMVar3->value).months = piVar2->months;
      (pMVar3->value).days = iVar6;
      (pMVar3->value).micros = iVar4;
      pMVar3->isset = true;
      return;
    }
    MaxOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
              (pMVar3,*piVar2,aggr_input_data);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_c0);
  Vector::ToUnifiedFormat(states,count,&local_78);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_c0.sel)->sel_vector[uVar9];
        }
        uVar8 = uVar9;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_78.sel)->sel_vector[uVar9];
        }
        pMVar3 = *(MinMaxState<duckdb::interval_t> **)(local_78.data + uVar8 * 8);
        uVar5 = *(undefined8 *)(local_c0.data + uVar7 * 0x10);
        iVar4 = *(int64_t *)(local_c0.data + uVar7 * 0x10 + 8);
        if (pMVar3->isset == false) {
          (pMVar3->value).months = (int)uVar5;
          (pMVar3->value).days = (int)((ulong)uVar5 >> 0x20);
          (pMVar3->value).micros = iVar4;
          pMVar3->isset = true;
        }
        else {
          input_01.micros = iVar4;
          input_01.months = (int)uVar5;
          input_01.days = (int)((ulong)uVar5 >> 0x20);
          MaxOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                    (pMVar3,input_01,aggr_input_data);
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (count != 0) {
    uVar9 = 0;
    do {
      uVar7 = uVar9;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(local_c0.sel)->sel_vector[uVar9];
      }
      uVar8 = uVar9;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(local_78.sel)->sel_vector[uVar9];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
           (uVar7 & 0x3f) & 1) != 0)) {
        pMVar3 = *(MinMaxState<duckdb::interval_t> **)(local_78.data + uVar8 * 8);
        uVar5 = *(undefined8 *)(local_c0.data + uVar7 * 0x10);
        iVar4 = *(int64_t *)(local_c0.data + uVar7 * 0x10 + 8);
        if (pMVar3->isset == false) {
          (pMVar3->value).months = (int)uVar5;
          (pMVar3->value).days = (int)((ulong)uVar5 >> 0x20);
          (pMVar3->value).micros = iVar4;
          pMVar3->isset = true;
        }
        else {
          input_00.micros = iVar4;
          input_00.months = (int)uVar5;
          input_00.days = (int)((ulong)uVar5 >> 0x20);
          MaxOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                    (pMVar3,input_00,aggr_input_data);
        }
      }
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}